

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasinterval.cpp
# Opt level: O0

BOOL __thiscall LASinterval::merge(LASinterval *this,BOOL erase)

{
  iterator iVar1;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  reference ppLVar5;
  LASintervalStartCell *this_00;
  reference ppVar6;
  size_type sVar7;
  LASintervalCell *this_01;
  LASintervalStartCell *pLStack_d0;
  I32 diff;
  LASintervalCell *last_cell;
  iterator local_b8;
  iterator map_element;
  pair<const_unsigned_int,_LASintervalCell_*> local_a0;
  _Self local_90;
  _Self local_88;
  iterator set_element_1;
  my_cell_map map;
  LASintervalCell *cell;
  _Rb_tree_const_iterator<LASintervalStartCell_*> local_38;
  iterator set_element;
  LASintervalCell *next;
  LASintervalCell *next_next;
  BOOL erase_local;
  LASinterval *this_local;
  
  if (this->merged_cells != (LASintervalStartCell *)0x0) {
    if ((this->merged_cells_temporary & 1U) != 0) {
      iVar1._M_node = (_Base_ptr)(this->merged_cells->super_LASintervalCell).next;
      while (set_element._M_node = iVar1._M_node, set_element._M_node != (_Base_ptr)0x0) {
        iVar1._M_node = (set_element._M_node)->_M_parent;
        if (set_element._M_node != (_Base_ptr)0x0) {
          operator_delete(set_element._M_node);
        }
      }
      if (this->merged_cells != (LASintervalStartCell *)0x0) {
        operator_delete(this->merged_cells);
      }
    }
    this->merged_cells = (LASintervalStartCell *)0x0;
  }
  if (this->cells_to_merge == (void *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    sVar4 = std::
            set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
            ::size((set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
                    *)this->cells_to_merge);
    if (sVar4 == 0) {
      this_local._7_1_ = false;
    }
    else {
      sVar4 = std::
              set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
              ::size((set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
                      *)this->cells_to_merge);
      if (sVar4 == 1) {
        this->merged_cells_temporary = false;
        local_38._M_node =
             (_Base_ptr)
             std::
             set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
             ::begin((set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
                      *)this->cells_to_merge);
        ppLVar5 = std::_Rb_tree_const_iterator<LASintervalStartCell_*>::operator*(&local_38);
        this->merged_cells = *ppLVar5;
      }
      else {
        this->merged_cells_temporary = true;
        this_00 = (LASintervalStartCell *)operator_new(0x20);
        LASintervalStartCell::LASintervalStartCell(this_00);
        this->merged_cells = this_00;
        std::
        multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
        ::multimap((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                    *)&set_element_1);
        local_88._M_node =
             (_Base_ptr)
             std::
             set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
             ::begin((set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
                      *)this->cells_to_merge);
        while( true ) {
          local_90._M_node =
               (_Base_ptr)
               std::
               set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
               ::end((set<LASintervalStartCell_*,_std::less<LASintervalStartCell_*>,_std::allocator<LASintervalStartCell_*>_>
                      *)this->cells_to_merge);
          bVar2 = std::operator==(&local_88,&local_90);
          if (bVar2) break;
          ppLVar5 = std::_Rb_tree_const_iterator<LASintervalStartCell_*>::operator*(&local_88);
          map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppLVar5;
          this->merged_cells->full =
               ((LASintervalStartCell *)map._M_t._M_impl.super__Rb_tree_header._M_node_count)->full
               + this->merged_cells->full;
          for (; map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0;
              map._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   *(size_t *)(map._M_t._M_impl.super__Rb_tree_header._M_node_count + 8)) {
            std::pair<const_unsigned_int,_LASintervalCell_*>::
            pair<unsigned_int_&,_LASintervalCell_*&,_true>
                      (&local_a0,(uint *)map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (LASintervalCell **)&map._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::
            multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
            ::insert((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                      *)&set_element_1,&local_a0);
          }
          map_element._M_node =
               (_Base_ptr)
               std::_Rb_tree_const_iterator<LASintervalStartCell_*>::operator++(&local_88,0);
        }
        local_b8 = std::
                   multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                   ::begin((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                            *)&set_element_1);
        ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_LASintervalCell_*>_>::
                 operator*(&local_b8);
        map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ppVar6->second;
        std::
        multimap<unsigned_int,LASintervalCell*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
        ::erase_abi_cxx11_((multimap<unsigned_int,LASintervalCell*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                            *)&set_element_1,local_b8);
        (this->merged_cells->super_LASintervalCell).start =
             *(U32 *)map._M_t._M_impl.super__Rb_tree_header._M_node_count;
        (this->merged_cells->super_LASintervalCell).end =
             *(U32 *)(map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
        this->merged_cells->total =
             (*(int *)(map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4) -
             *(int *)map._M_t._M_impl.super__Rb_tree_header._M_node_count) + 1;
        if ((erase) && (map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
          operator_delete((void *)map._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        pLStack_d0 = this->merged_cells;
        while (sVar7 = std::
                       multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                       ::size((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                               *)&set_element_1), sVar7 != 0) {
          local_b8 = std::
                     multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                     ::begin((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                              *)&set_element_1);
          ppVar6 = std::_Rb_tree_iterator<std::pair<const_unsigned_int,_LASintervalCell_*>_>::
                   operator*(&local_b8);
          map._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)ppVar6->second;
          std::
          multimap<unsigned_int,LASintervalCell*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
          ::erase_abi_cxx11_((multimap<unsigned_int,LASintervalCell*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,LASintervalCell*>>>
                              *)&set_element_1,local_b8);
          if ((int)this->threshold <
              (int)(*(int *)map._M_t._M_impl.super__Rb_tree_header._M_node_count -
                   (pLStack_d0->super_LASintervalCell).end)) {
            this_01 = (LASintervalCell *)operator_new(0x10);
            LASintervalCell::LASintervalCell
                      (this_01,(LASintervalCell *)
                               map._M_t._M_impl.super__Rb_tree_header._M_node_count);
            (pLStack_d0->super_LASintervalCell).next = this_01;
            pLStack_d0 = (LASintervalStartCell *)(pLStack_d0->super_LASintervalCell).next;
            this->merged_cells->total =
                 (*(int *)(map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4) -
                 *(int *)map._M_t._M_impl.super__Rb_tree_header._M_node_count) + 1 +
                 this->merged_cells->total;
          }
          else {
            iVar3 = *(int *)(map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4) -
                    (pLStack_d0->super_LASintervalCell).end;
            if (0 < iVar3) {
              (pLStack_d0->super_LASintervalCell).end =
                   *(U32 *)(map._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
              this->merged_cells->total = iVar3 + this->merged_cells->total;
            }
            this->number_intervals = this->number_intervals - 1;
          }
          if ((erase) && (map._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
            operator_delete((void *)map._M_t._M_impl.super__Rb_tree_header._M_node_count);
          }
        }
        std::
        multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
        ::~multimap((multimap<unsigned_int,_LASintervalCell_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_LASintervalCell_*>_>_>
                     *)&set_element_1);
      }
      this->current_cell = &this->merged_cells->super_LASintervalCell;
      this->full = this->merged_cells->full;
      this->total = this->merged_cells->total;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

BOOL LASinterval::merge(const BOOL erase)
{
  // maybe delete temporary merge cells from the previous merge
  if (merged_cells)
  {
    if (merged_cells_temporary)
    {
      LASintervalCell* next_next;
      LASintervalCell* next = merged_cells->next;
      while (next)
      {
        next_next = next->next;
        delete next;
        next = next_next;
      }
      delete merged_cells;
    }
    merged_cells = 0;
  }
  // are there cells to merge
  if (cells_to_merge == 0) return FALSE;
  if (((my_cell_set*)cells_to_merge)->size() == 0) return FALSE;
  // is there just one cell
  if (((my_cell_set*)cells_to_merge)->size() == 1)
  {
    merged_cells_temporary = FALSE;
    // simply use this cell as the merge cell
    my_cell_set::iterator set_element = ((my_cell_set*)cells_to_merge)->begin();
    merged_cells = (*set_element);
  }
  else
  {
    merged_cells_temporary = TRUE;
    merged_cells = new LASintervalStartCell();
    // iterate over all cells and add their intervals to map
    LASintervalCell* cell;
    my_cell_map map;
    my_cell_set::iterator set_element = ((my_cell_set*)cells_to_merge)->begin();
#pragma warning(push)
#pragma warning(disable : 6011)
    while (true)
    {
      if (set_element == ((my_cell_set*)cells_to_merge)->end()) break;
      cell = (*set_element);
      merged_cells->full += ((LASintervalStartCell*)cell)->full;
      while (cell)
      {
        map.insert(my_cell_map::value_type(cell->start, cell));
        cell = cell->next;
      }
      set_element++;
    }
#pragma warning(pop)
    // initialize merged_cells with first interval
    my_cell_map::iterator map_element = map.begin();
    cell = (*map_element).second;
    map.erase(map_element);
    merged_cells->start = cell->start;
    merged_cells->end = cell->end;
    merged_cells->total = cell->end - cell->start + 1;
    if (erase) delete cell;
    // merge intervals
    LASintervalCell* last_cell = merged_cells;
    I32 diff;
    while (map.size())
    {
      map_element = map.begin();
      cell = (*map_element).second;
      map.erase(map_element);
      diff = cell->start - last_cell->end;
      if (diff > (I32)threshold)
      {
        last_cell->next = new LASintervalCell(cell);
        last_cell = last_cell->next;
        merged_cells->total += (cell->end - cell->start + 1);
      }
      else
      {
        diff = cell->end - last_cell->end;
        if (diff > 0)
        {
          last_cell->end = cell->end;
          merged_cells->total += diff;
        }
        number_intervals--;
      }
      if (erase) delete cell;
    }
  }
  current_cell = merged_cells;
  full = merged_cells->full;
  total = merged_cells->total;
  return TRUE;
}